

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_labeltype.cxx
# Opt level: O1

void __thiscall Fl_Label::measure(Fl_Label *this,int *W,int *H)

{
  Fl_Label_Measure_F *UNRECOVERED_JUMPTABLE;
  
  if (this->image == (Fl_Image *)0x0 && this->value == (char *)0x0) {
    *H = 0;
    *W = 0;
    return;
  }
  UNRECOVERED_JUMPTABLE = fl_normal_measure;
  if (::measure[this->type] != (Fl_Label_Measure_F *)0x0) {
    UNRECOVERED_JUMPTABLE = ::measure[this->type];
  }
  (*UNRECOVERED_JUMPTABLE)(this,W,H);
  return;
}

Assistant:

void Fl_Label::measure(int& W, int& H) const {
  if (!value && !image) {
    W = H = 0;
    return;
  }

  Fl_Label_Measure_F* f = ::measure[type]; if (!f) f = fl_normal_measure;
  f(this, W, H);
}